

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O1

void __thiscall
ConfidentialValue_Constractor_bytedata9_Test::~ConfidentialValue_Constractor_bytedata9_Test
          (ConfidentialValue_Constractor_bytedata9_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_bytedata9) {
  // 8byte
  ConfidentialValue value(ByteData("010000000005f5e100"));
  EXPECT_STREQ(value.GetHex().c_str(), "010000000005f5e100");
  EXPECT_EQ(value.GetData().GetDataSize(), 9);
  EXPECT_EQ(value.HasBlinding(), false);
  EXPECT_EQ(value.GetAmount().GetSatoshiValue(), 100000000);
}